

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_setTimeout(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  int iVar2;
  JSRuntime *rt;
  void *pvVar3;
  long *opaque;
  JSValueUnion JVar5;
  ulong uVar6;
  JSValue JVar7;
  JSValue v;
  JSValue JVar8;
  timespec ts;
  int64_t delay;
  JSValueUnion local_50;
  long local_48;
  void *local_40;
  long local_38;
  JSValueUnion JVar4;
  
  rt = JS_GetRuntime(ctx);
  pvVar3 = JS_GetRuntimeOpaque(rt);
  JVar4 = (JSValueUnion)(argv->u).ptr;
  lVar1 = argv->tag;
  iVar2 = JS_IsFunction(ctx,*argv);
  if (iVar2 == 0) {
    JVar7 = JS_ThrowTypeError(ctx,"not a function");
    JVar4 = JVar7.u;
    JVar5.float64 = -NAN;
LAB_001142dc:
    v.tag = JVar7.tag;
    v.u.ptr = JVar4.ptr;
    uVar6 = (ulong)JVar5.ptr & (ulong)JVar7.u.ptr;
  }
  else {
    iVar2 = JS_ToInt64(ctx,&local_38,argv[1]);
    if (iVar2 == 0) {
      v = JS_NewObjectClass(ctx,js_os_timer_class_id);
      JVar5 = v.u;
      if ((uint)v.tag == 6) {
        uVar6 = (ulong)JVar5.ptr & 0xffffffff00000000;
        goto LAB_0011430a;
      }
      local_40 = pvVar3;
      opaque = (long *)js_mallocz(ctx,0x30);
      if (opaque != (long *)0x0) {
        *(undefined4 *)(opaque + 2) = 1;
        clock_gettime(1,(timespec *)&local_50);
        opaque[3] = local_48 / 1000000 + (long)local_50.ptr * 1000 + local_38;
        if (0xfffffff4 < (uint)lVar1) {
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
        }
        ((JSValueUnion *)(opaque + 4))->ptr = (void *)JVar4;
        opaque[5] = lVar1;
        lVar1 = *(long *)((long)local_40 + 0x20);
        *(long **)(lVar1 + 8) = opaque;
        *opaque = lVar1;
        opaque[1] = (long)local_40 + 0x20;
        *(long **)((long)local_40 + 0x20) = opaque;
        local_50 = JVar4;
        JS_SetOpaque(v,opaque);
        JVar7.tag = v.tag;
        JVar7.u.float64 = -NAN;
        JVar4 = JVar5;
        goto LAB_001142dc;
      }
      if ((0xfffffff4 < (uint)v.tag) &&
         (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
        local_50 = JVar5;
        __JS_FreeValue(ctx,v);
      }
    }
    v = (JSValue)(ZEXT816(6) << 0x40);
    uVar6 = 0;
  }
LAB_0011430a:
  JVar8.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar6);
  JVar8.tag = v.tag;
  return JVar8;
}

Assistant:

static JSValue js_os_setTimeout(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    int64_t delay;
    JSValueConst func;
    JSOSTimer *th;
    JSValue obj;

    func = argv[0];
    if (!JS_IsFunction(ctx, func))
        return JS_ThrowTypeError(ctx, "not a function");
    if (JS_ToInt64(ctx, &delay, argv[1]))
        return JS_EXCEPTION;
    obj = JS_NewObjectClass(ctx, js_os_timer_class_id);
    if (JS_IsException(obj))
        return obj;
    th = js_mallocz(ctx, sizeof(*th));
    if (!th) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    th->has_object = TRUE;
    th->timeout = get_time_ms() + delay;
    th->func = JS_DupValue(ctx, func);
    list_add_tail(&th->link, &ts->os_timers);
    JS_SetOpaque(obj, th);
    return obj;
}